

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<TPZFlopCounter>::SolveSOR
          (TPZMatrix<TPZFlopCounter> *this,int64_t *numiterations,TPZFMatrix<TPZFlopCounter> *F,
          TPZFMatrix<TPZFlopCounter> *result,TPZFMatrix<TPZFlopCounter> *residual,
          TPZFMatrix<TPZFlopCounter> *param_5,REAL overrelax,REAL *tol,int FromCurrent,int direction
          )

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  TPZFlopCounter __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x_00;
  undefined1 auVar12 [16];
  double local_a8;
  long lVar6;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  auVar12._8_4_ = 0xffffffff;
  auVar12._0_8_ = 0xffffffffffffffff;
  auVar12._12_4_ = 0xffffffff;
  TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
  TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] - auVar12._8_8_;
  if (residual == (TPZFMatrix<TPZFlopCounter> *)0x0) {
    local_a8 = *tol + *tol + 1.0;
  }
  else {
    __x = Dot<TPZFlopCounter>(residual,residual);
    if (__x.fVal < 0.0) {
      local_a8 = sqrt(__x.fVal);
    }
    else {
      local_a8 = SQRT(__x.fVal);
    }
    TPZFlopCounter::gCount.fCount[3] = TPZFlopCounter::gCount.fCount[3] + 1;
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar6 = CONCAT44(extraout_var,iVar5);
  lVar11 = 0;
  lVar7 = lVar6 + -1;
  lVar4 = -1;
  if (direction != -1) {
    lVar7 = lVar11;
    lVar4 = lVar6;
  }
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol;
    lVar11 = 0;
    do {
      if (ABS(local_a8) <= ABS(*tol)) break;
      if (lVar1 < 1) {
        __x_00 = 0.0;
      }
      else {
        __x_00 = 0.0;
        lVar8 = 0;
        lVar9 = 0;
        lVar3 = lVar7;
        do {
          for (; lVar3 != lVar4; lVar3 = lVar3 + (ulong)(direction != -1) * 2 + -1) {
            (*(F->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(F,lVar3,lVar9);
            local_a8 = extraout_XMM0_Qa;
            if (0 < lVar6) {
              lVar10 = 0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar3,lVar10);
                lVar2 = (result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow;
                if ((lVar2 <= lVar10) ||
                   ((result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar9)) {
                  TPZFMatrix<TPZFlopCounter>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_a8 = local_a8 -
                           extraout_XMM0_Qa_00 *
                           *(REAL *)((long)&result->fElem[lVar10].fVal + lVar2 * lVar8);
                TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
                TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
                lVar10 = lVar10 + 1;
              } while (lVar6 != lVar10);
            }
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 2;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar3)
            ;
            TPZFlopCounter::gCount.fCount[2] = TPZFlopCounter::gCount.fCount[2] + 1;
            if (((lVar3 < 0) ||
                (lVar10 = (result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fRow,
                lVar10 <= lVar3)) ||
               ((result->super_TPZMatrix<TPZFlopCounter>).super_TPZBaseMatrix.fCol <= lVar9)) {
              TPZFMatrix<TPZFlopCounter>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = lVar10 * lVar9;
            result->fElem[lVar10 + lVar3].fVal =
                 (local_a8 * overrelax) / extraout_XMM0_Qa_01 + result->fElem[lVar10 + lVar3].fVal;
            TPZFlopCounter::gCount.fCount[0] = TPZFlopCounter::gCount.fCount[0] + 1;
            __x_00 = __x_00 + local_a8 * local_a8;
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 8;
          lVar3 = lVar7;
        } while (lVar9 != lVar1);
      }
      if (__x_00 < 0.0) {
        local_a8 = sqrt(__x_00);
      }
      else {
        local_a8 = SQRT(__x_00);
      }
      TPZFlopCounter::gCount.fCount[3] = TPZFlopCounter::gCount.fCount[3] + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *numiterations);
  }
  if (residual != (TPZFMatrix<TPZFlopCounter> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,residual);
  }
  *numiterations = lVar11;
  *tol = ABS(local_a8);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}